

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void api_dynamic_suite::dynamic_operator_index(void)

{
  reference piVar1;
  ulong uVar2;
  initializer_list<int> input;
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  circular_view<int,_18446744073709551615UL> local_58;
  int local_38 [4];
  type local_28 [6];
  
  local_58.member.data = local_28;
  local_28[0] = 0;
  local_28[1] = 0;
  local_28[2] = 0;
  local_28[3] = 0;
  local_58.member.cap = 4;
  local_58.member.size = 0;
  local_58.member.next = 4;
  local_38[0] = 0xb;
  local_38[1] = 0x16;
  local_38[2] = 0x21;
  local_38[3] = 0x2c;
  input._M_len = 4;
  input._M_array = local_38;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_58,input);
  if ((local_58.member.cap & local_58.member.cap - 1) == 0) {
    uVar2 = local_58.member.cap - 1 & local_58.member.next - local_58.member.size;
  }
  else {
    uVar2 = (local_58.member.next - local_58.member.size) % local_58.member.cap;
  }
  local_38[0] = 0xb;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[0]","11",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xf8,"void api_dynamic_suite::dynamic_operator_index()",local_58.member.data + uVar2,
             local_38);
  uVar2 = (local_58.member.next - local_58.member.size) + 1;
  if ((local_58.member.cap & local_58.member.cap - 1) == 0) {
    uVar2 = local_58.member.cap - 1 & uVar2;
  }
  else {
    uVar2 = uVar2 % local_58.member.cap;
  }
  local_38[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[1]","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xf9,"void api_dynamic_suite::dynamic_operator_index()",local_58.member.data + uVar2,
             local_38);
  uVar2 = (local_58.member.next - local_58.member.size) + 2;
  if ((local_58.member.cap & local_58.member.cap - 1) == 0) {
    uVar2 = local_58.member.cap - 1 & uVar2;
  }
  else {
    uVar2 = uVar2 % local_58.member.cap;
  }
  local_38[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[2]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xfa,"void api_dynamic_suite::dynamic_operator_index()",local_58.member.data + uVar2,
             local_38);
  uVar2 = (local_58.member.next - local_58.member.size) + 3;
  if ((local_58.member.cap & local_58.member.cap - 1) == 0) {
    uVar2 = local_58.member.cap - 1 & uVar2;
  }
  else {
    uVar2 = uVar2 % local_58.member.cap;
  }
  local_38[0] = 0x2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[3]","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xfb,"void api_dynamic_suite::dynamic_operator_index()",local_58.member.data + uVar2,
             local_38);
  vista::circular_view<int,_18446744073709551615UL>::expand_back(&local_58,1);
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::back(&local_58);
  *piVar1 = 0x37;
  if ((local_58.member.cap & local_58.member.cap - 1) == 0) {
    uVar2 = local_58.member.cap - 1 & local_58.member.next - local_58.member.size;
  }
  else {
    uVar2 = (local_58.member.next - local_58.member.size) % local_58.member.cap;
  }
  local_38[0] = 0x16;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[0]","22",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xfd,"void api_dynamic_suite::dynamic_operator_index()",local_58.member.data + uVar2,
             local_38);
  uVar2 = (local_58.member.next - local_58.member.size) + 1;
  if ((local_58.member.cap & local_58.member.cap - 1) == 0) {
    uVar2 = local_58.member.cap - 1 & uVar2;
  }
  else {
    uVar2 = uVar2 % local_58.member.cap;
  }
  local_38[0] = 0x21;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[1]","33",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xfe,"void api_dynamic_suite::dynamic_operator_index()",local_58.member.data + uVar2,
             local_38);
  uVar2 = (local_58.member.next - local_58.member.size) + 2;
  if ((local_58.member.cap & local_58.member.cap - 1) == 0) {
    uVar2 = local_58.member.cap - 1 & uVar2;
  }
  else {
    uVar2 = uVar2 % local_58.member.cap;
  }
  local_38[0] = 0x2c;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[2]","44",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xff,"void api_dynamic_suite::dynamic_operator_index()",local_58.member.data + uVar2,
             local_38);
  uVar2 = (local_58.member.next - local_58.member.size) + 3;
  if ((local_58.member.cap & local_58.member.cap - 1) == 0) {
    uVar2 = local_58.member.cap - 1 & uVar2;
  }
  else {
    uVar2 = uVar2 % local_58.member.cap;
  }
  local_38[0] = 0x37;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("span[3]","55",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x100,"void api_dynamic_suite::dynamic_operator_index()",local_58.member.data + uVar2,
             local_38);
  return;
}

Assistant:

void dynamic_operator_index()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = {11, 22, 33, 44};
    BOOST_TEST_EQ(span[0], 11);
    BOOST_TEST_EQ(span[1], 22);
    BOOST_TEST_EQ(span[2], 33);
    BOOST_TEST_EQ(span[3], 44);
    span.push_back(55);
    BOOST_TEST_EQ(span[0], 22);
    BOOST_TEST_EQ(span[1], 33);
    BOOST_TEST_EQ(span[2], 44);
    BOOST_TEST_EQ(span[3], 55);
}